

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O3

int find_str(char *a,char *b,int lena,int lenb)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (lenb <= lena) {
    uVar3 = 0;
    pcVar4 = a;
    do {
      if (lenb < 1) {
LAB_001051bd:
        return (int)uVar3;
      }
      if (a[uVar3] == *b) {
        uVar1 = 1;
        do {
          uVar2 = uVar1;
          if ((uint)lenb == uVar2) break;
          uVar1 = uVar2 + 1;
        } while (pcVar4[uVar2] == b[uVar2]);
        if ((uint)lenb <= uVar2) goto LAB_001051bd;
      }
      uVar3 = uVar3 + 1;
      pcVar4 = pcVar4 + 1;
    } while (uVar3 != (lena - lenb) + 1);
  }
  return -1;
}

Assistant:

int find_str(char* a, const char* b,int lena,int lenb) {
	for (int i = 0; i < lena - lenb+1; i++)
	{
		if (bincmp(a + i, b, lenb))
			return i;
	}

	return -1;
}